

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_inverse(quaternion *self)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  anon_union_16_3_07544b10_for_quaternion_0 aVar4;
  float fVar5;
  
  fVar2 = quaternion_norm(self);
  fVar5 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar5 = fVar2;
  }
  if (1e-05 <= fVar5) {
    quaternion_conjugate(self);
    fVar3 = fVar2 + -1.0;
    fVar5 = -fVar3;
    if (-fVar3 <= fVar3) {
      fVar5 = fVar3;
    }
    if (1e-05 <= fVar5) {
      auVar1._4_4_ = fVar2;
      auVar1._0_4_ = fVar2;
      auVar1._8_4_ = fVar2;
      auVar1._12_4_ = fVar2;
      aVar4.q = (float  [4])divps(self->field_0,auVar1);
      self->field_0 = aVar4;
    }
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_inverse(struct quaternion *self)
{
	HYP_FLOAT norm;

	norm = quaternion_norm(self);

	if (scalar_equalsf(norm, 0.0f)) {
		/* avoid divide by zero */
		return self;
	}

	quaternion_conjugate(self);

	if (scalar_equalsf(norm, 1.0f)) {
		/* we're done */
		return self;
	}

	self->x /= norm;
	self->y /= norm;
	self->z /= norm;
	self->w /= norm;

	return self;
}